

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbistbl.cpp
# Opt level: O1

RBBINode * __thiscall icu_63::RBBISymbolTable::lookupNode(RBBISymbolTable *this,UnicodeString *key)

{
  void *pvVar1;
  RBBINode *pRVar2;
  
  pvVar1 = uhash_get_63(this->fHashTable,key);
  if (pvVar1 == (void *)0x0) {
    pRVar2 = (RBBINode *)0x0;
  }
  else {
    pRVar2 = *(RBBINode **)((long)pvVar1 + 0x48);
  }
  return pRVar2;
}

Assistant:

RBBINode       *RBBISymbolTable::lookupNode(const UnicodeString &key) const{

    RBBINode             *retNode = NULL;
    RBBISymbolTableEntry *el;

    el = (RBBISymbolTableEntry *)uhash_get(fHashTable, &key);
    if (el != NULL) {
        retNode = el->val;
    }
    return retNode;
}